

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_endpoint.hpp
# Opt level: O2

void __thiscall
websocketpp::server<websocketpp::config::asio>::start_accept
          (server<websocketpp::config::asio> *this,error_code *ec)

{
  error_category *peVar1;
  connection_ptr con;
  undefined1 local_90 [16];
  shared_ptr<websocketpp::connection<websocketpp::config::asio>_> local_80;
  undefined1 local_70 [40];
  accept_handler local_48;
  
  if ((this->
      super_endpoint<websocketpp::connection<websocketpp::config::asio>,_websocketpp::config::asio>)
      .super_transport_type.m_state == LISTENING) {
    peVar1 = (error_category *)std::_V2::system_category();
    ec->_M_value = 0;
    ec->_M_cat = peVar1;
    endpoint<websocketpp::connection<websocketpp::config::asio>,_websocketpp::config::asio>::
    create_connection((endpoint<websocketpp::connection<websocketpp::config::asio>,_websocketpp::config::asio>
                       *)local_90);
    if ((connection<websocketpp::config::asio> *)local_90._0_8_ ==
        (connection<websocketpp::config::asio> *)0x0) {
      peVar1 = error::get_category();
      ec->_M_value = 0x11;
      ec->_M_cat = peVar1;
    }
    else {
      std::
      static_pointer_cast<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>,websocketpp::connection<websocketpp::config::asio>>
                (&local_80);
      local_70._0_8_ = handle_accept;
      local_70._8_8_ = (error_category *)0x0;
      std::
      __shared_ptr<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr((__shared_ptr<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2>
                    *)(local_70 + 0x10),
                   (__shared_ptr<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2>
                    *)local_90);
      local_70._32_8_ = this;
      std::function<void(std::error_code_const&)>::
      function<std::_Bind<void(websocketpp::server<websocketpp::config::asio>::*(websocketpp::server<websocketpp::config::asio>*,std::shared_ptr<websocketpp::connection<websocketpp::config::asio>>,std::_Placeholder<1>))(std::shared_ptr<websocketpp::connection<websocketpp::config::asio>>,std::error_code_const&)>,void>
                ((function<void(std::error_code_const&)> *)&local_48,
                 (_Bind<void_(websocketpp::server<websocketpp::config::asio>::*(websocketpp::server<websocketpp::config::asio>_*,_std::shared_ptr<websocketpp::connection<websocketpp::config::asio>_>,_std::_Placeholder<1>))(std::shared_ptr<websocketpp::connection<websocketpp::config::asio>_>,_const_std::error_code_&)>
                  *)local_70);
      transport::asio::endpoint<websocketpp::config::asio::transport_config>::async_accept
                ((endpoint<websocketpp::config::asio::transport_config> *)this,
                 (transport_con_ptr *)&local_80,&local_48,ec);
      std::_Function_base::~_Function_base(&local_48.super__Function_base);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 0x18));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_80.
                  super___shared_ptr<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      if ((ec->_M_value != 0) &&
         ((connection<websocketpp::config::asio> *)local_90._0_8_ !=
          (connection<websocketpp::config::asio> *)0x0)) {
        local_70._0_8_ = local_70._0_8_ & 0xffffffff00000000;
        local_70._8_8_ = peVar1;
        connection<websocketpp::config::asio>::terminate
                  ((connection<websocketpp::config::asio> *)local_90._0_8_,(error_code *)local_70);
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_90 + 8));
  }
  else {
    peVar1 = error::get_category();
    ec->_M_value = 0x19;
    ec->_M_cat = peVar1;
  }
  return;
}

Assistant:

void start_accept(lib::error_code & ec) {
        if (!transport_type::is_listening()) {
            ec = error::make_error_code(error::async_accept_not_listening);
            return;
        }
        
        ec = lib::error_code();
        connection_ptr con = get_connection();

        if (!con) {
          ec = error::make_error_code(error::con_creation_failed);
          return;
        }

        transport_type::async_accept(
            lib::static_pointer_cast<transport_con_type>(con),
            lib::bind(&type::handle_accept,this,con,lib::placeholders::_1),
            ec
        );

        if (ec && con) {
            // If the connection was constructed but the accept failed,
            // terminate the connection to prevent memory leaks
            con->terminate(lib::error_code());
        }
    }